

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_pidd.hpp
# Opt level: O0

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
astar_pidd::AStarPIDD<Tiles>::search(AStarPIDD<Tiles> *this,State *init)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  State *pSVar4;
  reference pvVar5;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *in_RSI;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *in_RDI;
  Edge<Tiles> e;
  int op;
  int i_1;
  State parent_state;
  Node<Tiles> parent;
  State state;
  value_type n;
  size_t i;
  vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> nodes;
  vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> reopened_nodes;
  CompressClosedListAsync<Node<Tiles>_> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  PackedState in_stack_fffffffffffffe80;
  State *in_stack_fffffffffffffe88;
  CompressClosedListAsync<Node<Tiles>_> *in_stack_fffffffffffffe90;
  State *in_stack_fffffffffffffe98;
  State *s;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined1 uVar6;
  pointer *this_00;
  Node<Tiles> *in_stack_fffffffffffffec8;
  CompressOpenList<Node<Tiles>_> *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffee0;
  AStarPIDD<Tiles> *in_stack_fffffffffffffee8;
  Node<Tiles> *in_stack_fffffffffffffef8;
  CompressClosedListAsync<Node<Tiles>_> *in_stack_ffffffffffffff00;
  int local_f0;
  undefined1 local_da [76];
  char cStack_8e;
  PackedState local_88;
  PackedState local_80;
  State *local_78;
  vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> local_60 [4];
  
  this_00 = &in_RSI[0xb].super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  wrap((AStarPIDD<Tiles> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
       in_stack_fffffffffffffe98,(Node<Tiles> *)in_stack_fffffffffffffe90,
       (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)in_stack_fffffffffffffe88);
  compress::CompressOpenList<Node<Tiles>_>::push
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  do {
    bVar1 = compress::CompressOpenList<Node<Tiles>_>::isempty
                      ((CompressOpenList<Node<Tiles>_> *)
                       &in_RSI[0xb].super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar6 = false;
    if (!bVar1) {
      sVar3 = std::vector<Tiles::State,_std::allocator<Tiles::State>_>::size(in_RSI + 0xe);
      uVar6 = sVar3 == 0;
    }
    if ((bool)uVar6 == false) {
      std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
                ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)this_00,in_RSI);
      return in_RDI;
    }
    std::vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_>::vector
              ((vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> *)0x12ab3f);
    collect_unique_nodes(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    compress::CompressClosedListAsync<Node<Tiles>_>::batch_duplicate_detection
              ((CompressClosedListAsync<Node<Tiles>_> *)
               reopened_nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage,
               (vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> *)
               reopened_nodes.super__Vector_base<Node<Tiles>,_std::allocator<Node<Tiles>_>_>._M_impl
               .super__Vector_impl_data._M_finish);
    local_78 = (State *)0x0;
LAB_0012ab7c:
    s = local_78;
    pSVar4 = (State *)std::vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_>::size(local_60);
    if (s < pSVar4) {
      pvVar5 = std::vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_>::operator[]
                         (local_60,(size_type)local_78);
      unique0x00012000 = *(undefined8 *)pvVar5;
      local_88.word = (pvVar5->parent_packed).word;
      local_da._42_8_ = (pvVar5->packed).word;
      local_80.word = local_da._42_8_;
      Tiles::unpack((Tiles *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    (State *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe80);
      bVar1 = Tiles::isgoal((Tiles *)(in_RSI->
                                     super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>
                                     )._M_impl.super__Vector_impl_data._M_finish,
                            (State *)(local_da + 0x38));
      if (!bVar1) break;
      std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back
                ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)
                 in_stack_fffffffffffffe80.word,
                 (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      while (bVar1 = Tiles::PackedState::operator!=(&local_80,&local_88), bVar1) {
        compress::CompressClosedListAsync<Node<Tiles>_>::trace_parent
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        in_stack_fffffffffffffe90 = (CompressClosedListAsync<Node<Tiles>_> *)local_da;
        Tiles::unpack((Tiles *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                      (State *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe80);
        std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back
                  ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)
                   in_stack_fffffffffffffe80.word,
                   (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        unique0x00012000 = local_da._18_8_;
        local_88.word = local_da._26_8_;
        local_80.word = local_da._34_8_;
      }
      compress::CompressClosedListAsync<Node<Tiles>_>::print_statistics(in_stack_fffffffffffffe90);
      compress::CompressOpenList<Node<Tiles>_>::clear
                ((CompressOpenList<Node<Tiles>_> *)in_stack_fffffffffffffe70);
      compress::CompressClosedListAsync<Node<Tiles>_>::clear(in_stack_fffffffffffffe70);
      in_stack_fffffffffffffe88 = (State *)std::operator<<((ostream *)&std::cout,"duplicates ");
      in_stack_fffffffffffffe80.word =
           std::ostream::operator<<
                     ((ostream *)in_stack_fffffffffffffe88,
                      (ulong)in_RSI[0xf].
                             super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl
                             .super__Vector_impl_data._M_start);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffe80.word,std::endl<char,std::char_traits<char>>);
      std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
                ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)this_00,in_RSI);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_>::~vector
              ((vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> *)in_stack_fffffffffffffe80.word)
    ;
    std::vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_>::~vector
              ((vector<Node<Tiles>,_std::allocator<Node<Tiles>_>_> *)in_stack_fffffffffffffe80.word)
    ;
    if (bVar1) {
      return in_RDI;
    }
  } while( true );
  (in_RSI->super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(((in_RSI->super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage)->tiles + 1);
  local_f0 = 0;
  while (in_stack_fffffffffffffe7c = local_f0,
        iVar2 = Tiles::nops((Tiles *)(in_RSI->
                                     super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>
                                     )._M_impl.super__Vector_impl_data._M_finish,
                            (State *)(local_da + 0x38)), in_stack_fffffffffffffe7c < iVar2) {
    iVar2 = Tiles::nthop((Tiles *)(in_RSI->
                                  super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>).
                                  _M_impl.super__Vector_impl_data._M_finish,
                         (State *)(local_da + 0x38),local_f0);
    if (iVar2 != cStack_8e) {
      in_RSI[1].super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((in_RSI[1].super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                      _M_impl.super__Vector_impl_data._M_start)->tiles + 1);
      Tiles::apply((Tiles *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (int)(in_stack_fffffffffffffe80.word >> 0x20));
      in_stack_fffffffffffffe70 =
           (CompressClosedListAsync<Node<Tiles>_> *)
           &in_RSI[0xb].super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      wrap((AStarPIDD<Tiles> *)CONCAT17(uVar6,in_stack_fffffffffffffea0),s,
           (Node<Tiles> *)in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
           (int)in_stack_fffffffffffffe88);
      compress::CompressOpenList<Node<Tiles>_>::push
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      Tiles::undo((Tiles *)(in_RSI->super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>)
                           ._M_impl.super__Vector_impl_data._M_finish,(State *)(local_da + 0x38),
                  (Edge<Tiles> *)&stack0xfffffffffffffee4);
    }
    local_f0 = local_f0 + 1;
  }
  local_78 = (State *)(local_78->tiles + 1);
  goto LAB_0012ab7c;
}

Assistant:

std::vector<typename Domain::State>
        search(typename Domain::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (!open.isempty() && path.size() == 0) {
                // temporary placeholder for intermediate reopenings
                std::vector<Node<Domain> > reopened_nodes;

                auto nodes = collect_unique_nodes(N_THREADS);
                
                closed.batch_duplicate_detection(nodes);
                               
                for (std::size_t i = 0; i < nodes.size(); ++i) {
                    auto n = nodes[i];
                    
                    typename Domain::State state;
                    this->dom.unpack(state, n.packed);

                    if (this->dom.isgoal(state)) {
                        // trace path here
                        path.push_back(state);
                        while(n.packed != n.parent_packed) {
                            Node<Domain> parent = closed.trace_parent(n);
                            typename Domain::State parent_state;
                            this->dom.unpack(parent_state, parent.packed);
                            path.push_back(parent_state);
                            n = parent;
                        }
                        closed.print_statistics();
                        open.clear();
                        closed.clear();
                        std::cout << "duplicates " << duplicates << std::endl;
                        return path;
                    }

                    this->expd++;
                    for (int i = 0; i < this->dom.nops(state); i++) {
                        int op = this->dom.nthop(state, i);
                        if (op == n.pop)
                            continue;
                        this->gend++;
                        Edge<Domain> e = this->dom.apply(state, op);
                        open.push(wrap(state, &n, e.cost, e.pop));
                        this->dom.undo(state, e);
                    }
                }
            }
            return path;
        }